

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compare.h
# Opt level: O0

bool Gs::Compare<float,3ul,3ul>(Matrix<float,_3UL,_3UL> *lhs,Matrix<float,_3UL,_3UL> *rhs)

{
  float fVar1;
  float *pfVar2;
  ulong local_30;
  size_t r;
  size_t c;
  Matrix<float,_3UL,_3UL> *rhs_local;
  Matrix<float,_3UL,_3UL> *lhs_local;
  
  r = 0;
  do {
    if (2 < r) {
      return false;
    }
    for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
      pfVar2 = Matrix<float,_3UL,_3UL>::operator()(lhs,local_30,r);
      fVar1 = *pfVar2;
      pfVar2 = Matrix<float,_3UL,_3UL>::operator()(rhs,local_30,r);
      if (fVar1 < *pfVar2) {
        return true;
      }
      pfVar2 = Matrix<float,_3UL,_3UL>::operator()(lhs,local_30,r);
      fVar1 = *pfVar2;
      pfVar2 = Matrix<float,_3UL,_3UL>::operator()(rhs,local_30,r);
      if (*pfVar2 <= fVar1 && fVar1 != *pfVar2) {
        return false;
      }
    }
    r = r + 1;
  } while( true );
}

Assistant:

bool Compare(const Matrix<T, Rows, Cols>& lhs, const Matrix<T, Rows, Cols>& rhs)
{
    /*
    Alwasy compare in the same order (no matter if row-major storage is used or not),
    to ensure always the same sorting results for strict-weak-ordering
    */
    for (std::size_t c = 0; c < Cols; ++c)
    {
        for (std::size_t r = 0; r < Rows; ++r)
        {
            if (lhs(r, c) < rhs(r, c))
                return true;
            if (lhs(r, c) > rhs(r, c))
                return false;
        }
    }
    return false;
}